

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode Curl_mime_prepare_headers
                   (curl_mimepart *part,char *contenttype,char *disposition,mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  curl_mimepart *part_00;
  char *local_50;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar4 = part->mimetype;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = search_header(part->userheaders,"Content-Type");
  }
  if (pcVar4 != (char *)0x0) {
    contenttype = pcVar4;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (((contenttype == (char *)0x0) &&
          (contenttype = Curl_mime_contenttype(part->data), contenttype == (char *)0x0)) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    ppcVar7 = &part_00->data;
    if (part_00 == (curl_mimepart *)0x0) {
      ppcVar7 = (char **)0x0;
    }
  }
  else {
    if (((pcVar4 == (char *)0x0) && (contenttype != (char *)0x0)) &&
       ((iVar3 = Curl_strcasecompare(contenttype,"text/plain"), iVar3 != 0 &&
        ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))))) {
      contenttype = (char *)0x0;
    }
    part_00 = (curl_mimepart *)0x0;
    ppcVar7 = (char **)0x0;
  }
  slp = &part->curlheaders;
  pcVar4 = search_header(part->userheaders,"Content-Disposition");
  if (pcVar4 == (char *)0x0) {
    if (((disposition != (char *)0x0) || (disposition = "attachment", part->filename != (char *)0x0)
        ) || (part->name != (char *)0x0)) {
LAB_0013cb83:
      iVar3 = curl_strequal(disposition,"attachment");
      pcVar4 = part->name;
      if (iVar3 == 0) {
        if (pcVar4 != (char *)0x0) goto LAB_0013cbb7;
LAB_0013cbd9:
        pcVar4 = (char *)0x0;
LAB_0013cbdb:
        if (part->filename == (char *)0x0) {
          local_50 = (char *)0x0;
        }
        else {
          local_50 = escape_string(part->filename);
          if (local_50 == (char *)0x0) {
            CVar2 = CURLE_OUT_OF_MEMORY;
            local_50 = (char *)0x0;
            goto LAB_0013cc78;
          }
        }
        pcVar5 = "; name=\"";
        pcVar8 = pcVar4;
        if (pcVar4 == (char *)0x0) {
          pcVar5 = "";
          pcVar8 = "";
        }
        pcVar10 = "\"";
        pcVar9 = "\"";
        if (pcVar4 == (char *)0x0) {
          pcVar9 = "";
        }
        pcVar11 = "; filename=\"";
        pcVar6 = local_50;
        if (local_50 == (char *)0x0) {
          pcVar11 = "";
          pcVar6 = "";
          pcVar10 = "";
        }
        CVar2 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar5,pcVar8,
                           pcVar9,pcVar11,pcVar6,pcVar10);
      }
      else {
        if (pcVar4 == (char *)0x0) {
          if (part->filename == (char *)0x0) goto LAB_0013cb16;
          goto LAB_0013cbd9;
        }
LAB_0013cbb7:
        pcVar4 = escape_string(pcVar4);
        if (pcVar4 != (char *)0x0) goto LAB_0013cbdb;
        CVar2 = CURLE_OUT_OF_MEMORY;
        local_50 = (char *)0x0;
        pcVar4 = (char *)0x0;
      }
LAB_0013cc78:
      (*Curl_cfree)(pcVar4);
      (*Curl_cfree)(local_50);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      goto LAB_0013cb16;
    }
    if (contenttype == (char *)0x0) goto LAB_0013ccca;
    iVar3 = Curl_strncasecompare(contenttype,"multipart/",10);
    disposition = "attachment";
    if (iVar3 == 0) goto LAB_0013cb83;
LAB_0013cb1f:
    pcVar4 = "; boundary=";
    if (ppcVar7 == (char **)0x0) {
      pcVar4 = "";
      ppcVar7 = (char **)0x1558d9;
    }
    CVar2 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar4,ppcVar7);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    bVar1 = true;
  }
  else {
LAB_0013cb16:
    if (contenttype != (char *)0x0) goto LAB_0013cb1f;
LAB_0013ccca:
    bVar1 = false;
  }
  pcVar4 = search_header(part->userheaders,"Content-Transfer-Encoding");
  if (pcVar4 == (char *)0x0) {
    if (part->encoder == (mime_encoder *)0x0) {
      if ((!bVar1 || strategy != MIMESTRATEGY_MAIL) || (part->kind == MIMEKIND_MULTIPART))
      goto LAB_0013cce6;
      pcVar4 = "8bit";
    }
    else {
      pcVar4 = part->encoder->name;
      if (pcVar4 == (char *)0x0) goto LAB_0013cce6;
    }
    CVar2 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s",pcVar4);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
LAB_0013cce6:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = part->curlheaders;
    (part->state).offset = 0;
  }
  CVar2 = CURLE_OK;
  if ((part_00 != (curl_mimepart *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    iVar3 = Curl_strcasecompare(contenttype,"multipart/form-data");
    pcVar4 = (char *)0x0;
    if (iVar3 != 0) {
      pcVar4 = "form-data";
    }
    do {
      part_00 = part_00->nextpart;
      if (part_00 == (curl_mimepart *)0x0) {
        return CURLE_OK;
      }
      CVar2 = Curl_mime_prepare_headers(part_00,(char *)0x0,pcVar4,strategy);
    } while (CVar2 == CURLE_OK);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_mime_prepare_headers(curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, "Content-Type");
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          strcasecompare(contenttype, "text/plain"))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, "Content-Disposition")) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(part->name);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(part->filename);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders, "Content-Transfer-Encoding")) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(strcasecompare(contenttype, "multipart/form-data"))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(subpart, NULL, disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}